

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc07_k.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPC07_K>::eval_exc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  dVar1 = cbrt(1.0);
  dVar2 = cbrt(rho);
  dVar6 = 1.0 / dVar2;
  dVar7 = rho * rho;
  dVar5 = 1.0 / (dVar2 * dVar2);
  dVar3 = sigma * 1.5874010519681996 * 0.3949273883044934 * (dVar5 / dVar7);
  dVar9 = dVar3 * 0.06944444444444445;
  dVar4 = (lapl * lapl * 1.2599210498948732 * 0.1559676420330081 * (dVar6 / (dVar7 * rho))) / 2916.0
  ;
  auVar8._0_8_ = sigma * sigma * 1.2599210498948732 * 0.1559676420330081 *
                 (dVar6 / (dVar7 * dVar7 * rho));
  auVar8._8_8_ = lapl * (dVar6 / (dVar7 * dVar7)) * 1.2599210498948732 * sigma * 0.1559676420330081;
  auVar8 = divpd(auVar8,_DAT_0103cc00);
  dVar6 = (dVar4 - auVar8._8_8_) + auVar8._0_8_;
  dVar6 = (1.0 / ((dVar9 + 1.0) * (dVar9 + 1.0))) * dVar6 * dVar6 + 1.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = (((lapl * 1.5874010519681996 * 0.036567350768934574 * (dVar5 / rho) +
             dVar3 * 0.007716049382716049 + 1.0 + dVar4) - auVar8._8_8_) + auVar8._0_8_) *
          (1.0 / dVar6) - dVar9;
  dVar3 = 0.013472500000000002;
  if (0.013472500000000002 <= dVar6) {
    dVar3 = dVar6;
  }
  if (0.5254275 <= dVar3) {
    dVar3 = 0.5254275;
  }
  dVar4 = exp((1.0 / dVar3) * -1.6167000000000002);
  dVar5 = exp(-0.5389 / (0.5389 - dVar3));
  dVar7 = pow(dVar5 + 1.0,3.0);
  dVar3 = exp((1.0 / dVar3) * -0.5389);
  dVar3 = pow(dVar3 + dVar5,3.0);
  dVar1 = dVar1 * dVar1 * dVar2 * dVar2 * 1.4356170000940958 *
          ((double)(~-(ulong)(dVar6 <= 0.013472500000000002) &
                   (-(ulong)(0.5254275 <= dVar6) & 0x3ff0000000000000 |
                   ~-(ulong)(0.5254275 <= dVar6) & (ulong)((1.0 / dVar3) * dVar7 * dVar4))) * dVar6
          + dVar9);
  *eps = (double)(~-(ulong)(rho * 0.5 <= 1e-15) & (ulong)(dVar1 + dVar1));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps ) {

    (void)(tau);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_pi;
    constexpr double t25 = constants::m_cbrt_6;
    constexpr double t26 = constants::m_pi_sq;
    constexpr double t27 = constants::m_cbrt_pi_sq;
    constexpr double t31 = constants::m_cbrt_2;
    constexpr double t5 = t4 * t4;
    constexpr double t28 = t27 * t27;
    constexpr double t29 = 0.1e1 / t28;
    constexpr double t30 = t25 * t29;
    constexpr double t32 = t31 * t31;
    constexpr double t47 = t25 * t25;
    constexpr double t49 = 0.1e1 / t27 / t26;
    constexpr double t50 = t47 * t49;
    constexpr double t87 = a / 0.4e2;
    constexpr double t89 = 0.39e2 / 0.4e2 * a;
    constexpr double t91 = a * b;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = t5 * t6 * M_PI;
    const double t9 = 0.1e1 <= zeta_tol;
    const double t10 = zeta_tol - 0.1e1;
    const double t12 = piecewise_functor_5( t9, t10, t9, -t10, 0.0 );
    const double t13 = 0.1e1 + t12;
    const double t15 = safe_math::cbrt( zeta_tol );
    const double t16 = t15 * t15;
    const double t18 = safe_math::cbrt( t13 );
    const double t19 = t18 * t18;
    const double t21 = piecewise_functor_3( t13 <= zeta_tol, t16 * zeta_tol, t19 * t13 );
    const double t22 = safe_math::cbrt( rho );
    const double t23 = t22 * t22;
    const double t24 = t21 * t23;
    const double t33 = sigma * t32;
    const double t34 = rho * rho;
    const double t36 = 0.1e1 / t23 / t34;
    const double t38 = t30 * t33 * t36;
    const double t39 = 0.5e1 / 0.72e2 * t38;
    const double t41 = lapl * t32;
    const double t43 = 0.1e1 / t23 / rho;
    const double t51 = lapl * lapl;
    const double t52 = t51 * t31;
    const double t53 = t34 * rho;
    const double t55 = 0.1e1 / t22 / t53;
    const double t58 = t50 * t52 * t55 / 0.2916e4;
    const double t59 = t50 * sigma;
    const double t60 = t34 * t34;
    const double t62 = 0.1e1 / t22 / t60;
    const double t63 = t31 * t62;
    const double t64 = t63 * lapl;
    const double t66 = t59 * t64 / 0.2592e4;
    const double t67 = sigma * sigma;
    const double t68 = t67 * t31;
    const double t69 = t60 * rho;
    const double t71 = 0.1e1 / t22 / t69;
    const double t74 = t50 * t68 * t71 / 0.8748e4;
    const double t75 = 0.1e1 + 0.5e1 / 0.648e3 * t38 + 0.5e1 / 0.54e2 * t30 * t41 * t43 + t58 - t66 + t74;
    const double t76 = t58 - t66 + t74;
    const double t77 = t76 * t76;
    const double t78 = 0.1e1 + t39;
    const double t79 = t78 * t78;
    const double t80 = 0.1e1 / t79;
    const double t82 = t77 * t80 + 0.1e1;
    const double t83 = safe_math::sqrt( t82 );
    const double t84 = 0.1e1 / t83;
    const double t86 = t75 * t84 - t39;
    const double t88 = t86 <= t87;
    const double t90 = t89 <= t86;
    const double t92 = t86 < t87;
    const double t93 = piecewise_functor_3( t92, t87, t86 );
    const double t94 = t93 < t89;
    const double t95 = piecewise_functor_3( t94, t93, t89 );
    const double t96 = 0.1e1 / t95;
    const double t98 = safe_math::exp( -t91 * t96 );
    const double t99 = a - t95;
    const double t102 = safe_math::exp( -a / t99 );
    const double t103 = 0.1e1 + t102;
    const double t104 = safe_math::pow( t103, b );
    const double t105 = t98 * t104;
    const double t107 = safe_math::exp( -a * t96 );
    const double t108 = t107 + t102;
    const double t109 = safe_math::pow( t108, b );
    const double t110 = 0.1e1 / t109;
    const double t111 = t105 * t110;
    const double t112 = piecewise_functor_5( t88, 0.0, t90, 1.0, t111 );
    const double t114 = t86 * t112 + t39;
    const double t118 = piecewise_functor_3( t3, 0.0, 0.3e1 / 0.2e2 * t8 * t24 * t114 );


    eps = 0.2e1 * t118;

  }